

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_section(GlobalVars *gv,Elf32_Ehdr *ehdr,ObjectUnit *ou,Elf32_Shdr *shdr,int shndx,
                  char *shstrtab)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long size;
  uint8_t *data;
  char *name;
  GlobalVars *gv_00;
  Section *pSVar3;
  undefined8 in_RDX;
  long in_RSI;
  uint32_t in_R8D;
  uint64_t in_R9;
  Section *s;
  bool be;
  void *in_stack_ffffffffffffff68;
  bool in_stack_ffffffffffffff74;
  uint32_t shtype;
  undefined4 in_stack_ffffffffffffffb0;
  uint64_t shflags;
  uint8_t in_stack_ffffffffffffffd8;
  
  shtype = (uint32_t)((ulong)in_RDX >> 0x20);
  shflags = in_R9;
  uVar1 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  size = in_R9 + uVar1;
  uVar1 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  data = (uint8_t *)(in_RSI + (ulong)uVar1);
  uVar1 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  name = (char *)(ulong)uVar1;
  uVar1 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  uVar2 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  gv_00 = (GlobalVars *)(ulong)uVar2;
  uVar2 = read32(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  shiftcnt(uVar2);
  pSVar3 = elf_add_section(gv_00,(ObjectUnit *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),name,data,
                           size,shtype,shflags,in_stack_ffffffffffffffd8);
  if (pSVar3 != (Section *)0x0) {
    uVar1 = read32(in_stack_ffffffffffffff74,gv_00);
    pSVar3->link = uVar1;
    pSVar3->id = in_R8D;
  }
  return;
}

Assistant:

static void elf32_section(struct GlobalVars *gv,struct Elf32_Ehdr *ehdr,
                          struct ObjectUnit *ou,struct Elf32_Shdr *shdr,
                          int shndx,char *shstrtab)
/* create a new section */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct Section *s;

  if (s = elf_add_section(gv,ou,
                          shstrtab+read32(be,shdr->sh_name),
                          (uint8_t *)ehdr+read32(be,shdr->sh_offset),
                          read32(be,shdr->sh_size),
                          read32(be,shdr->sh_type),
                          read32(be,shdr->sh_flags),
                          shiftcnt(read32(be,shdr->sh_addralign)))) {
    s->link = read32(be,shdr->sh_link);  /* save link for later use */
    s->id = shndx;  /* use section header index for identification */
  }
}